

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GayBerneAdapter.cpp
# Opt level: O0

GBAtypeParameters * __thiscall OpenMD::GayBerneAdapter::getGayBerneParam(GayBerneAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  GBAtypeParameters *__src;
  GBAtypeParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> gbData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff28;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff30;
  string *psVar3;
  string *in_stack_ffffffffffffff40;
  errorStruct *in_stack_ffffffffffffff48;
  string local_98 [64];
  string local_58 [48];
  string local_28 [40];
  
  bVar1 = isGayBerne((GayBerneAdapter *)0x2bc68b);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam was passed an atomType (%s)\n\tthat does not appear to be a Gay-Berne atom.\n"
             ,uVar2);
    std::__cxx11::string::~string(local_28);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName((AtomType *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  bVar1 = std::operator==(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_58;
    uVar2 = std::__cxx11::string::c_str();
    in_stack_ffffffffffffff48 = &painCave;
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam could not find Gay-Berne\n\tparameters for atomType %s.\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 0x7d4) = 1;
    *(undefined4 *)((long)in_stack_ffffffffffffff48->errMsg + 2000) = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff48);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *)
                          in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff28);
    psVar3 = local_98;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "GayBerneAdapter::getGayBerneParam could not convert\n\tGenericData to GBAtypeData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(psVar3);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2bc880);
  __src = SimpleTypeData<OpenMD::GBAtypeParameters>::getData(this_00);
  memcpy(in_RDI,__src,0x30);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::GBAtypeParameters>_> *)0x2bc8ab);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2bc8b8);
  return in_RDI;
}

Assistant:

GBAtypeParameters GayBerneAdapter::getGayBerneParam() {
    if (!isGayBerne()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam was passed an atomType (%s)\n"
               "\tthat does not appear to be a Gay-Berne atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(GBtypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam could not find Gay-Berne\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GBAtypeData> gbData =
        std::dynamic_pointer_cast<GBAtypeData>(data);
    if (gbData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GayBerneAdapter::getGayBerneParam could not convert\n"
               "\tGenericData to GBAtypeData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return gbData->getData();
  }